

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AgenPeeps.cpp
# Opt level: O3

int __thiscall
AgenPeeps::MoveInstrUp(AgenPeeps *this,Instr *instrToMove,Instr *blockStart,int bound)

{
  code *pcVar1;
  int iVar2;
  bool bVar3;
  undefined4 *puVar4;
  Instr *pIVar5;
  int iVar6;
  
  bVar3 = LowererMD::IsAssign(instrToMove);
  if (!bVar3) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/AgenPeeps.cpp"
                       ,0x51,"(LowererMD::IsAssign(instrToMove))",
                       "We only reschedule move instructions for now");
    if (!bVar3) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar4 = 0;
  }
  iVar6 = 0;
  if (instrToMove != blockStart) {
    pIVar5 = IR::Instr::GetPrevRealInstr(instrToMove);
    bVar3 = DependentInstrs(this,instrToMove,pIVar5);
    iVar6 = 0;
    if (!bVar3) {
      pIVar5 = IR::Instr::GetPrevRealInstr(instrToMove);
      IR::Instr::Unlink(instrToMove);
      bVar3 = DependentInstrs(this,instrToMove,pIVar5);
      iVar6 = 0;
      if (!bVar3) {
        iVar2 = 1;
        do {
          iVar6 = iVar2;
          if ((pIVar5 == blockStart) || (0 < bound && bound == iVar6)) {
            IR::Instr::InsertBefore(pIVar5,instrToMove);
            return iVar6;
          }
          pIVar5 = IR::Instr::GetPrevRealInstr(pIVar5);
          bVar3 = DependentInstrs(this,instrToMove,pIVar5);
          iVar2 = iVar6 + 1;
        } while (!bVar3);
      }
      IR::Instr::InsertAfter(pIVar5,instrToMove);
    }
  }
  return iVar6;
}

Assistant:

int AgenPeeps::MoveInstrUp(IR::Instr *instrToMove, IR::Instr *blockStart, int bound)
{
    AssertMsg(LowererMD::IsAssign(instrToMove), "We only reschedule move instructions for now");
    IR::Instr *instr;
    int i = 1;
    if (instrToMove == blockStart || DependentInstrs(instrToMove, instrToMove->GetPrevRealInstr()))
        return 0;

    instr = instrToMove->GetPrevRealInstr();
    instrToMove->Unlink();

    while (!DependentInstrs(instrToMove, instr))
    {
        if (instr == blockStart || (bound > 0 && i == bound))
        {
            instr->InsertBefore(instrToMove);
            return i;
        }
        instr = instr->GetPrevRealInstr();
        i++;
    }
    // Insert after dependent instruction
    instr->InsertAfter(instrToMove);

    return i - 1;
}